

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O1

TestCaseGroup * vkt::compute::createBasicComputeShaderTests(TestContext *testCtx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestContext *testCtx_00;
  TestNode *pTVar3;
  BufferToBufferInvertTest *pBVar4;
  string local_90;
  string local_70;
  TestNode *local_50;
  IVec3 local_48;
  IVec3 local_3c;
  
  local_50 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_50,testCtx,"basic","Basic compute tests")
  ;
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"empty_shader","");
  paVar2 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Shader that does nothing","")
  ;
  testCtx_00 = local_50->m_testCtx;
  pTVar3 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx_00,NODETYPE_SELF_VALIDATE,local_70._M_dataplus._M_p,
             local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d1b7f0;
  pTVar3[1]._vptr_TestNode = (_func_int **)anon_unknown_0::EmptyShaderTest::createProgram;
  pTVar3[1].m_testCtx = (TestContext *)anon_unknown_0::EmptyShaderTest::createTest;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"ubo_to_ssbo_single_invocation","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"Copy from UBO to SSBO, inverting bits","");
  local_3c.m_data[0] = 1;
  local_3c.m_data[1] = 1;
  local_3c.m_data[2] = 1;
  local_48.m_data[0] = 1;
  local_48.m_data[1] = 1;
  local_48.m_data[2] = 1;
  pBVar4 = anon_unknown_0::BufferToBufferInvertTest::UBOToSSBOInvertCase
                     (testCtx,&local_70,&local_90,0x100,&local_3c,&local_48);
  tcu::TestNode::addChild(local_50,(TestNode *)pBVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ubo_to_ssbo_single_group","")
  ;
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"Copy from UBO to SSBO, inverting bits","");
  local_3c.m_data[0] = 2;
  local_3c.m_data[1] = 1;
  local_3c.m_data[2] = 4;
  local_48.m_data[0] = 1;
  local_48.m_data[1] = 1;
  local_48.m_data[2] = 1;
  pBVar4 = anon_unknown_0::BufferToBufferInvertTest::UBOToSSBOInvertCase
                     (testCtx,&local_70,&local_90,0x400,&local_3c,&local_48);
  tcu::TestNode::addChild(local_50,(TestNode *)pBVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"ubo_to_ssbo_multiple_invocations","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"Copy from UBO to SSBO, inverting bits","");
  local_3c.m_data[0] = 1;
  local_3c.m_data[1] = 1;
  local_3c.m_data[2] = 1;
  local_48.m_data[0] = 2;
  local_48.m_data[1] = 4;
  local_48.m_data[2] = 1;
  pBVar4 = anon_unknown_0::BufferToBufferInvertTest::UBOToSSBOInvertCase
                     (testCtx,&local_70,&local_90,0x400,&local_3c,&local_48);
  tcu::TestNode::addChild(local_50,(TestNode *)pBVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"ubo_to_ssbo_multiple_groups","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"Copy from UBO to SSBO, inverting bits","");
  local_3c.m_data[0] = 1;
  local_3c.m_data[1] = 4;
  local_3c.m_data[2] = 2;
  local_48.m_data[0] = 2;
  local_48.m_data[1] = 2;
  local_48.m_data[2] = 4;
  pBVar4 = anon_unknown_0::BufferToBufferInvertTest::UBOToSSBOInvertCase
                     (testCtx,&local_70,&local_90,0x400,&local_3c,&local_48);
  tcu::TestNode::addChild(local_50,(TestNode *)pBVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"copy_ssbo_single_invocation","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"Copy between SSBOs, inverting bits","");
  local_3c.m_data[0] = 1;
  local_3c.m_data[1] = 1;
  local_3c.m_data[2] = 1;
  local_48.m_data[0] = 1;
  local_48.m_data[1] = 1;
  local_48.m_data[2] = 1;
  pBVar4 = anon_unknown_0::BufferToBufferInvertTest::CopyInvertSSBOCase
                     (testCtx,&local_70,&local_90,0x100,&local_3c,&local_48);
  tcu::TestNode::addChild(local_50,(TestNode *)pBVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"copy_ssbo_multiple_invocations","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"Copy between SSBOs, inverting bits","");
  local_3c.m_data[0] = 1;
  local_3c.m_data[1] = 1;
  local_3c.m_data[2] = 1;
  local_48.m_data[0] = 2;
  local_48.m_data[1] = 4;
  local_48.m_data[2] = 1;
  pBVar4 = anon_unknown_0::BufferToBufferInvertTest::CopyInvertSSBOCase
                     (testCtx,&local_70,&local_90,0x400,&local_3c,&local_48);
  tcu::TestNode::addChild(local_50,(TestNode *)pBVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"copy_ssbo_multiple_groups","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"Copy between SSBOs, inverting bits","");
  local_3c.m_data[0] = 1;
  local_3c.m_data[1] = 4;
  local_3c.m_data[2] = 2;
  local_48.m_data[0] = 2;
  local_48.m_data[1] = 2;
  local_48.m_data[2] = 4;
  pBVar4 = anon_unknown_0::BufferToBufferInvertTest::CopyInvertSSBOCase
                     (testCtx,&local_70,&local_90,0x400,&local_3c,&local_48);
  tcu::TestNode::addChild(local_50,(TestNode *)pBVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x90);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"ssbo_rw_single_invocation","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Read and write same SSBO","")
  ;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2bdc0;
  *(undefined4 *)&pTVar3[1]._vptr_TestNode = 0x100;
  *(undefined1 *)((long)&pTVar3[1]._vptr_TestNode + 4) = 1;
  pTVar3[1].m_testCtx = (TestContext *)0x100000001;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x100000001;
  pTVar3[1].m_name._M_string_length = 0x100000001;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x90);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ssbo_rw_multiple_groups","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Read and write same SSBO","")
  ;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2bdc0;
  *(undefined4 *)&pTVar3[1]._vptr_TestNode = 0x400;
  *(undefined1 *)((long)&pTVar3[1]._vptr_TestNode + 4) = 1;
  pTVar3[1].m_testCtx = (TestContext *)0x400000001;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x200000002;
  pTVar3[1].m_name._M_string_length = 0x400000002;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x90);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"ssbo_unsized_arr_single_invocation","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Read and write same SSBO","")
  ;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2bdc0;
  *(undefined4 *)&pTVar3[1]._vptr_TestNode = 0x100;
  *(undefined1 *)((long)&pTVar3[1]._vptr_TestNode + 4) = 0;
  pTVar3[1].m_testCtx = (TestContext *)0x100000001;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x100000001;
  pTVar3[1].m_name._M_string_length = 0x100000001;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x90);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"ssbo_unsized_arr_multiple_groups","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Read and write same SSBO","")
  ;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2bdc0;
  *(undefined4 *)&pTVar3[1]._vptr_TestNode = 0x400;
  *(undefined1 *)((long)&pTVar3[1]._vptr_TestNode + 4) = 0;
  pTVar3[1].m_testCtx = (TestContext *)0x400000001;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x200000002;
  pTVar3[1].m_name._M_string_length = 0x400000002;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x90);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"write_multiple_arr_single_invocation","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Write to multiple SSBOs","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2be60;
  *(undefined4 *)&pTVar3[1]._vptr_TestNode = 0x100;
  *(undefined1 *)((long)&pTVar3[1]._vptr_TestNode + 4) = 1;
  pTVar3[1].m_testCtx = (TestContext *)0x100000001;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x100000001;
  pTVar3[1].m_name._M_string_length = 0x100000001;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x90);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"write_multiple_arr_multiple_groups","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Write to multiple SSBOs","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2be60;
  *(undefined4 *)&pTVar3[1]._vptr_TestNode = 0x400;
  *(undefined1 *)((long)&pTVar3[1]._vptr_TestNode + 4) = 1;
  pTVar3[1].m_testCtx = (TestContext *)0x400000001;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x200000002;
  pTVar3[1].m_name._M_string_length = 0x400000002;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x90);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"write_multiple_unsized_arr_single_invocation","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Write to multiple SSBOs","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2be60;
  *(undefined4 *)&pTVar3[1]._vptr_TestNode = 0x100;
  *(undefined1 *)((long)&pTVar3[1]._vptr_TestNode + 4) = 0;
  pTVar3[1].m_testCtx = (TestContext *)0x100000001;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x100000001;
  pTVar3[1].m_name._M_string_length = 0x100000001;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x90);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"write_multiple_unsized_arr_multiple_groups","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Write to multiple SSBOs","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2be60;
  *(undefined4 *)&pTVar3[1]._vptr_TestNode = 0x400;
  *(undefined1 *)((long)&pTVar3[1]._vptr_TestNode + 4) = 0;
  pTVar3[1].m_testCtx = (TestContext *)0x400000001;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x200000002;
  pTVar3[1].m_name._M_string_length = 0x400000002;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x88);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"ssbo_local_barrier_single_invocation","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"SSBO local barrier usage","")
  ;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2bf00;
  pTVar3[1]._vptr_TestNode = (_func_int **)0x100000001;
  pTVar3[1].m_testCtx = (TestContext *)0x100000001;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x100000001;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x88);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"ssbo_local_barrier_single_group","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"SSBO local barrier usage","")
  ;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2bf00;
  pTVar3[1]._vptr_TestNode = (_func_int **)0x200000003;
  pTVar3[1].m_testCtx = (TestContext *)0x100000005;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x100000001;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x88);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"ssbo_local_barrier_multiple_groups","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"SSBO local barrier usage","")
  ;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2bf00;
  pTVar3[1]._vptr_TestNode = (_func_int **)0x400000003;
  pTVar3[1].m_testCtx = (TestContext *)0x200000001;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x300000007;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x80);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ssbo_cmd_barrier_single","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"SSBO memory barrier usage","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2bfa0;
  pTVar3[1]._vptr_TestNode = (_func_int **)0x100000001;
  *(undefined4 *)&pTVar3[1].m_testCtx = 1;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x80);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"ssbo_cmd_barrier_multiple","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"SSBO memory barrier usage","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2bfa0;
  pTVar3[1]._vptr_TestNode = (_func_int **)0x50000000b;
  *(undefined4 *)&pTVar3[1].m_testCtx = 7;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x88);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"shared_var_single_invocation","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"Basic shared variable usage","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2c040;
  pTVar3[1]._vptr_TestNode = (_func_int **)0x100000001;
  pTVar3[1].m_testCtx = (TestContext *)0x100000001;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x100000001;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x88);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"shared_var_single_group","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"Basic shared variable usage","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2c040;
  pTVar3[1]._vptr_TestNode = (_func_int **)0x200000003;
  pTVar3[1].m_testCtx = (TestContext *)0x100000005;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x100000001;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x88);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"shared_var_multiple_invocations","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"Basic shared variable usage","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2c040;
  pTVar3[1]._vptr_TestNode = (_func_int **)0x100000001;
  pTVar3[1].m_testCtx = (TestContext *)0x200000001;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x400000005;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x88);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"shared_var_multiple_groups","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"Basic shared variable usage","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2c040;
  pTVar3[1]._vptr_TestNode = (_func_int **)0x400000003;
  pTVar3[1].m_testCtx = (TestContext *)0x200000001;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x300000007;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x88);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"shared_atomic_op_single_invocation","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"Atomic operation with shared var","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2c0e0;
  pTVar3[1]._vptr_TestNode = (_func_int **)0x100000001;
  pTVar3[1].m_testCtx = (TestContext *)0x100000001;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x100000001;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x88);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"shared_atomic_op_single_group","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"Atomic operation with shared var","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2c0e0;
  pTVar3[1]._vptr_TestNode = (_func_int **)0x200000003;
  pTVar3[1].m_testCtx = (TestContext *)0x100000005;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x100000001;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x88);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"shared_atomic_op_multiple_invocations","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"Atomic operation with shared var","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2c0e0;
  pTVar3[1]._vptr_TestNode = (_func_int **)0x100000001;
  pTVar3[1].m_testCtx = (TestContext *)0x200000001;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x400000005;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x88);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"shared_atomic_op_multiple_groups","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"Atomic operation with shared var","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2c0e0;
  pTVar3[1]._vptr_TestNode = (_func_int **)0x400000003;
  pTVar3[1].m_testCtx = (TestContext *)0x200000001;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x300000007;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x80);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"copy_image_to_ssbo_small","")
  ;
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Image to SSBO copy","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2c180;
  pTVar3[1]._vptr_TestNode = (_func_int **)0x100000001;
  pTVar3[1].m_testCtx = (TestContext *)0x4000000040;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x80);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"copy_image_to_ssbo_large","")
  ;
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Image to SSBO copy","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2c180;
  pTVar3[1]._vptr_TestNode = (_func_int **)0x400000002;
  pTVar3[1].m_testCtx = (TestContext *)0x20000000200;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x80);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"copy_ssbo_to_image_small","")
  ;
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"SSBO to image copy","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2c220;
  pTVar3[1]._vptr_TestNode = (_func_int **)0x100000001;
  pTVar3[1].m_testCtx = (TestContext *)0x4000000040;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x80);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"copy_ssbo_to_image_large","")
  ;
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"SSBO to image copy","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2c220;
  pTVar3[1]._vptr_TestNode = (_func_int **)0x400000002;
  pTVar3[1].m_testCtx = (TestContext *)0x20000000200;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x80);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"image_atomic_op_local_size_1","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"Atomic operation with image","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2c2c0;
  pTVar3[1]._vptr_TestNode = (_func_int **)0x4000000001;
  *(undefined4 *)&pTVar3[1].m_testCtx = 0x40;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x80);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"image_atomic_op_local_size_8","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"Atomic operation with image","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2c2c0;
  pTVar3[1]._vptr_TestNode = (_func_int **)0x4000000008;
  *(undefined4 *)&pTVar3[1].m_testCtx = 0x40;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x78);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"image_barrier_single","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Image barrier","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2c360;
  pTVar3[1]._vptr_TestNode = (_func_int **)0x100000001;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TestNode *)operator_new(0x78);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"image_barrier_multiple","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Image barrier","");
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,testCtx,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2c360;
  pTVar3[1]._vptr_TestNode = (_func_int **)0x4000000040;
  tcu::TestNode::addChild(local_50,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return (TestCaseGroup *)local_50;
}

Assistant:

tcu::TestCaseGroup* createBasicComputeShaderTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> basicComputeTests(new tcu::TestCaseGroup(testCtx, "basic", "Basic compute tests"));

	addFunctionCaseWithPrograms(basicComputeTests.get(), "empty_shader", "Shader that does nothing", EmptyShaderTest::createProgram, EmptyShaderTest::createTest);

	basicComputeTests->addChild(BufferToBufferInvertTest::UBOToSSBOInvertCase(testCtx,	"ubo_to_ssbo_single_invocation",	"Copy from UBO to SSBO, inverting bits",	256,	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(BufferToBufferInvertTest::UBOToSSBOInvertCase(testCtx,	"ubo_to_ssbo_single_group",			"Copy from UBO to SSBO, inverting bits",	1024,	tcu::IVec3(2,1,4),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(BufferToBufferInvertTest::UBOToSSBOInvertCase(testCtx,	"ubo_to_ssbo_multiple_invocations",	"Copy from UBO to SSBO, inverting bits",	1024,	tcu::IVec3(1,1,1),	tcu::IVec3(2,4,1)));
	basicComputeTests->addChild(BufferToBufferInvertTest::UBOToSSBOInvertCase(testCtx,	"ubo_to_ssbo_multiple_groups",		"Copy from UBO to SSBO, inverting bits",	1024,	tcu::IVec3(1,4,2),	tcu::IVec3(2,2,4)));

	basicComputeTests->addChild(BufferToBufferInvertTest::CopyInvertSSBOCase(testCtx,	"copy_ssbo_single_invocation",		"Copy between SSBOs, inverting bits",	256,	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(BufferToBufferInvertTest::CopyInvertSSBOCase(testCtx,	"copy_ssbo_multiple_invocations",	"Copy between SSBOs, inverting bits",	1024,	tcu::IVec3(1,1,1),	tcu::IVec3(2,4,1)));
	basicComputeTests->addChild(BufferToBufferInvertTest::CopyInvertSSBOCase(testCtx,	"copy_ssbo_multiple_groups",		"Copy between SSBOs, inverting bits",	1024,	tcu::IVec3(1,4,2),	tcu::IVec3(2,2,4)));

	basicComputeTests->addChild(new InvertSSBOInPlaceTest(testCtx,	"ssbo_rw_single_invocation",			"Read and write same SSBO",		256,	true,	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new InvertSSBOInPlaceTest(testCtx,	"ssbo_rw_multiple_groups",				"Read and write same SSBO",		1024,	true,	tcu::IVec3(1,4,2),	tcu::IVec3(2,2,4)));
	basicComputeTests->addChild(new InvertSSBOInPlaceTest(testCtx,	"ssbo_unsized_arr_single_invocation",	"Read and write same SSBO",		256,	false,	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new InvertSSBOInPlaceTest(testCtx,	"ssbo_unsized_arr_multiple_groups",		"Read and write same SSBO",		1024,	false,	tcu::IVec3(1,4,2),	tcu::IVec3(2,2,4)));

	basicComputeTests->addChild(new WriteToMultipleSSBOTest(testCtx,	"write_multiple_arr_single_invocation",			"Write to multiple SSBOs",	256,	true,	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new WriteToMultipleSSBOTest(testCtx,	"write_multiple_arr_multiple_groups",			"Write to multiple SSBOs",	1024,	true,	tcu::IVec3(1,4,2),	tcu::IVec3(2,2,4)));
	basicComputeTests->addChild(new WriteToMultipleSSBOTest(testCtx,	"write_multiple_unsized_arr_single_invocation",	"Write to multiple SSBOs",	256,	false,	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new WriteToMultipleSSBOTest(testCtx,	"write_multiple_unsized_arr_multiple_groups",	"Write to multiple SSBOs",	1024,	false,	tcu::IVec3(1,4,2),	tcu::IVec3(2,2,4)));

	basicComputeTests->addChild(new SSBOLocalBarrierTest(testCtx,	"ssbo_local_barrier_single_invocation",	"SSBO local barrier usage",	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new SSBOLocalBarrierTest(testCtx,	"ssbo_local_barrier_single_group",		"SSBO local barrier usage",	tcu::IVec3(3,2,5),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new SSBOLocalBarrierTest(testCtx,	"ssbo_local_barrier_multiple_groups",	"SSBO local barrier usage",	tcu::IVec3(3,4,1),	tcu::IVec3(2,7,3)));

	basicComputeTests->addChild(new SSBOBarrierTest(testCtx,	"ssbo_cmd_barrier_single",		"SSBO memory barrier usage",	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new SSBOBarrierTest(testCtx,	"ssbo_cmd_barrier_multiple",	"SSBO memory barrier usage",	tcu::IVec3(11,5,7)));

	basicComputeTests->addChild(new SharedVarTest(testCtx,	"shared_var_single_invocation",		"Basic shared variable usage",	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new SharedVarTest(testCtx,	"shared_var_single_group",			"Basic shared variable usage",	tcu::IVec3(3,2,5),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new SharedVarTest(testCtx,	"shared_var_multiple_invocations",	"Basic shared variable usage",	tcu::IVec3(1,1,1),	tcu::IVec3(2,5,4)));
	basicComputeTests->addChild(new SharedVarTest(testCtx,	"shared_var_multiple_groups",		"Basic shared variable usage",	tcu::IVec3(3,4,1),	tcu::IVec3(2,7,3)));

	basicComputeTests->addChild(new SharedVarAtomicOpTest(testCtx,	"shared_atomic_op_single_invocation",		"Atomic operation with shared var",		tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new SharedVarAtomicOpTest(testCtx,	"shared_atomic_op_single_group",			"Atomic operation with shared var",		tcu::IVec3(3,2,5),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new SharedVarAtomicOpTest(testCtx,	"shared_atomic_op_multiple_invocations",	"Atomic operation with shared var",		tcu::IVec3(1,1,1),	tcu::IVec3(2,5,4)));
	basicComputeTests->addChild(new SharedVarAtomicOpTest(testCtx,	"shared_atomic_op_multiple_groups",			"Atomic operation with shared var",		tcu::IVec3(3,4,1),	tcu::IVec3(2,7,3)));

	basicComputeTests->addChild(new CopyImageToSSBOTest(testCtx,	"copy_image_to_ssbo_small",	"Image to SSBO copy",	tcu::IVec2(1,1),	tcu::IVec2(64,64)));
	basicComputeTests->addChild(new CopyImageToSSBOTest(testCtx,	"copy_image_to_ssbo_large",	"Image to SSBO copy",	tcu::IVec2(2,4),	tcu::IVec2(512,512)));

	basicComputeTests->addChild(new CopySSBOToImageTest(testCtx,	"copy_ssbo_to_image_small",	"SSBO to image copy",	tcu::IVec2(1, 1),	tcu::IVec2(64, 64)));
	basicComputeTests->addChild(new CopySSBOToImageTest(testCtx,	"copy_ssbo_to_image_large",	"SSBO to image copy",	tcu::IVec2(2, 4),	tcu::IVec2(512, 512)));

	basicComputeTests->addChild(new ImageAtomicOpTest(testCtx,	"image_atomic_op_local_size_1",	"Atomic operation with image",	1,	tcu::IVec2(64,64)));
	basicComputeTests->addChild(new ImageAtomicOpTest(testCtx,	"image_atomic_op_local_size_8",	"Atomic operation with image",	8,	tcu::IVec2(64,64)));

	basicComputeTests->addChild(new ImageBarrierTest(testCtx,	"image_barrier_single",		"Image barrier",	tcu::IVec2(1,1)));
	basicComputeTests->addChild(new ImageBarrierTest(testCtx,	"image_barrier_multiple",	"Image barrier",	tcu::IVec2(64,64)));

	return basicComputeTests.release();
}